

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O1

BOOL __thiscall FuncInfo::IsClassMember(FuncInfo *this)

{
  ParseableFunctionInfo *pPVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  pPVar1 = this->byteCodeFunction;
  if ((pPVar1->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x576,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_008ad1eb;
    *puVar4 = 0;
  }
  if ((ParseableFunctionInfo *)
      (((pPVar1->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != pPVar1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x577,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                       "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar3) {
LAB_008ad1eb:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  return ((pPVar1->super_FunctionProxy).functionInfo.ptr)->attributes >> 9 & 1;
}

Assistant:

BOOL FuncInfo::IsClassMember() const
{
    return this->byteCodeFunction->IsClassMethod();
}